

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int listener_setup_ssl(h2o_configurator_command_t *cmd,h2o_configurator_context_t *ctx,
                      yoml_t *listen_node,yoml_t *ssl_node,listener_config_t *listener,
                      int listener_is_new)

{
  yoml_t_conflict *pyVar1;
  yoml_t_conflict *node;
  size_t sVar2;
  bool bVar3;
  yoml_t *pyVar4;
  yoml_t *pyVar5;
  yoml_t *pyVar6;
  yoml_t *pyVar7;
  yoml_t *pyVar8;
  yoml_t *pyVar9;
  yoml_t *pyVar10;
  yoml_t *pyVar11;
  int iVar12;
  SSL_METHOD *meth;
  char *pcVar13;
  bool bVar14;
  h2o_buffer_t *local_228;
  char *errstr;
  h2o_buffer_t *respbuf;
  h2o_iovec_t local_200;
  listener_ssl_config_t *local_1f0;
  listener_ssl_config_t *ssl_config;
  DH *dh;
  BIO *bio;
  char errbuf [256];
  listener_ssl_config_t *ssl_config_1;
  size_t i_1;
  yoml_t *value;
  yoml_t *key;
  size_t i;
  int use_picotls;
  int use_neverbleed;
  uint ocsp_max_failures;
  uint64_t ocsp_update_interval;
  long ssl_options;
  yoml_t *ocsp_max_failures_node;
  yoml_t *ocsp_update_interval_node;
  yoml_t *ocsp_update_cmd;
  yoml_t *cipher_suite;
  yoml_t *max_version;
  yoml_t *min_version;
  yoml_t *dh_file;
  yoml_t *key_file;
  yoml_t *certificate_file;
  SSL_CTX *ssl_ctx;
  listener_config_t *plStack_38;
  int listener_is_new_local;
  listener_config_t *listener_local;
  yoml_t *ssl_node_local;
  yoml_t *listen_node_local;
  h2o_configurator_context_t *ctx_local;
  h2o_configurator_command_t *cmd_local;
  
  certificate_file = (yoml_t *)0x0;
  key_file = (yoml_t *)0x0;
  dh_file = (yoml_t *)0x0;
  min_version = (yoml_t *)0x0;
  max_version = (yoml_t *)0x0;
  cipher_suite = (yoml_t *)0x0;
  ocsp_update_cmd = (yoml_t *)0x0;
  ocsp_update_interval_node = (yoml_t *)0x0;
  ocsp_max_failures_node = (yoml_t *)0x0;
  ssl_options = 0;
  ocsp_update_interval = 0x80000850;
  _use_neverbleed = 0x3840;
  use_picotls = 3;
  bVar3 = true;
  bVar14 = true;
  ssl_ctx._4_4_ = listener_is_new;
  plStack_38 = listener;
  listener_local = (listener_config_t *)ssl_node;
  ssl_node_local = listen_node;
  listen_node_local = (yoml_t *)ctx;
  ctx_local = (h2o_configurator_context_t *)cmd;
  if (listener_is_new == 0) {
    if (((listener->ssl).size != 0) && (ssl_node == (yoml_t *)0x0)) {
      h2o_configurator_errprintf
                (cmd,listen_node,"cannot accept HTTP; already defined to accept HTTPS");
      return -1;
    }
    if (((listener->ssl).size == 0) && (ssl_node != (yoml_t *)0x0)) {
      h2o_configurator_errprintf(cmd,ssl_node,"cannot accept HTTPS; already defined to accept HTTP")
      ;
      return -1;
    }
  }
  if (ssl_node == (yoml_t *)0x0) {
    return 0;
  }
  if (ssl_node->type != YOML_TYPE_MAPPING) {
    h2o_configurator_errprintf(cmd,ssl_node,"`ssl` is not a mapping");
    return -1;
  }
  for (key = (yoml_t *)0x0; key != *(yoml_t **)((listener_local->addr).__ss_padding + 0x2e);
      key = (yoml_t *)((long)&key->type + 1)) {
    pyVar1 = *(yoml_t_conflict **)((listener_local->addr).__ss_padding + (long)key * 0x10 + 0x36);
    node = *(yoml_t_conflict **)((listener_local->addr).__ss_padding + (long)key * 0x10 + 0x3e);
    if (pyVar1->type != YOML_TYPE_SCALAR) {
      h2o_configurator_errprintf
                ((h2o_configurator_command_t *)0x0,pyVar1,"command must be a string");
      return -1;
    }
    iVar12 = strcmp((pyVar1->data).scalar,"certificate-file");
    if (iVar12 == 0) {
      pyVar1 = (yoml_t_conflict *)ssl_options;
      pyVar4 = ocsp_max_failures_node;
      pyVar5 = ocsp_update_interval_node;
      pyVar6 = ocsp_update_cmd;
      pyVar7 = cipher_suite;
      pyVar8 = max_version;
      pyVar9 = min_version;
      pyVar10 = dh_file;
      pyVar11 = node;
      if (node->type != YOML_TYPE_SCALAR) {
        h2o_configurator_errprintf
                  ((h2o_configurator_command_t *)ctx_local,node,
                   "property of `certificate-file` must be a string");
        return -1;
      }
    }
    else {
      iVar12 = strcmp((pyVar1->data).scalar,"key-file");
      if (iVar12 == 0) {
        pyVar1 = (yoml_t_conflict *)ssl_options;
        pyVar4 = ocsp_max_failures_node;
        pyVar5 = ocsp_update_interval_node;
        pyVar6 = ocsp_update_cmd;
        pyVar7 = cipher_suite;
        pyVar8 = max_version;
        pyVar9 = min_version;
        pyVar10 = node;
        pyVar11 = key_file;
        if (node->type != YOML_TYPE_SCALAR) {
          h2o_configurator_errprintf
                    ((h2o_configurator_command_t *)ctx_local,node,
                     "property of `key-file` must be a string");
          return -1;
        }
      }
      else {
        iVar12 = strcmp((pyVar1->data).scalar,"min-version");
        pyVar8 = node;
        if (iVar12 == 0) {
          pyVar1 = (yoml_t_conflict *)ssl_options;
          pyVar4 = ocsp_max_failures_node;
          pyVar5 = ocsp_update_interval_node;
          pyVar6 = ocsp_update_cmd;
          pyVar7 = cipher_suite;
          pyVar9 = min_version;
          pyVar10 = dh_file;
          pyVar11 = key_file;
          if (node->type != YOML_TYPE_SCALAR) {
            h2o_configurator_errprintf
                      ((h2o_configurator_command_t *)ctx_local,node,
                       "property of `min-version` must be a string");
            return -1;
          }
        }
        else {
          iVar12 = strcmp((pyVar1->data).scalar,"minimum-version");
          if (iVar12 == 0) {
            pyVar1 = (yoml_t_conflict *)ssl_options;
            pyVar4 = ocsp_max_failures_node;
            pyVar5 = ocsp_update_interval_node;
            pyVar6 = ocsp_update_cmd;
            pyVar7 = cipher_suite;
            pyVar9 = min_version;
            pyVar10 = dh_file;
            pyVar11 = key_file;
            if (node->type != YOML_TYPE_SCALAR) {
              h2o_configurator_errprintf
                        ((h2o_configurator_command_t *)ctx_local,node,
                         "property of `minimum-version` must be a string");
              return -1;
            }
          }
          else {
            iVar12 = strcmp((pyVar1->data).scalar,"max-version");
            pyVar7 = node;
            if (iVar12 == 0) {
              pyVar1 = (yoml_t_conflict *)ssl_options;
              pyVar4 = ocsp_max_failures_node;
              pyVar5 = ocsp_update_interval_node;
              pyVar6 = ocsp_update_cmd;
              pyVar8 = max_version;
              pyVar9 = min_version;
              pyVar10 = dh_file;
              pyVar11 = key_file;
              if (node->type != YOML_TYPE_SCALAR) {
                h2o_configurator_errprintf
                          ((h2o_configurator_command_t *)ctx_local,node,
                           "property of `max-version` must be a string");
                return -1;
              }
            }
            else {
              iVar12 = strcmp((pyVar1->data).scalar,"maximum-version");
              if (iVar12 == 0) {
                pyVar1 = (yoml_t_conflict *)ssl_options;
                pyVar4 = ocsp_max_failures_node;
                pyVar5 = ocsp_update_interval_node;
                pyVar6 = ocsp_update_cmd;
                pyVar8 = max_version;
                pyVar9 = min_version;
                pyVar10 = dh_file;
                pyVar11 = key_file;
                if (node->type != YOML_TYPE_SCALAR) {
                  h2o_configurator_errprintf
                            ((h2o_configurator_command_t *)ctx_local,node,
                             "property of `maximum-version` must be a string");
                  return -1;
                }
              }
              else {
                iVar12 = strcmp((pyVar1->data).scalar,"cipher-suite");
                if (iVar12 == 0) {
                  pyVar1 = (yoml_t_conflict *)ssl_options;
                  pyVar4 = ocsp_max_failures_node;
                  pyVar5 = ocsp_update_interval_node;
                  pyVar6 = node;
                  pyVar7 = cipher_suite;
                  pyVar8 = max_version;
                  pyVar9 = min_version;
                  pyVar10 = dh_file;
                  pyVar11 = key_file;
                  if (node->type != YOML_TYPE_SCALAR) {
                    h2o_configurator_errprintf
                              ((h2o_configurator_command_t *)ctx_local,node,
                               "property of `cipher-suite` must be a string");
                    return -1;
                  }
                }
                else {
                  iVar12 = strcmp((pyVar1->data).scalar,"ocsp-update-cmd");
                  if (iVar12 == 0) {
                    pyVar1 = (yoml_t_conflict *)ssl_options;
                    pyVar4 = ocsp_max_failures_node;
                    pyVar5 = node;
                    pyVar6 = ocsp_update_cmd;
                    pyVar7 = cipher_suite;
                    pyVar8 = max_version;
                    pyVar9 = min_version;
                    pyVar10 = dh_file;
                    pyVar11 = key_file;
                    if (node->type != YOML_TYPE_SCALAR) {
                      h2o_configurator_errprintf
                                ((h2o_configurator_command_t *)ctx_local,node,
                                 "property of `ocsp-update-cmd` must be a string");
                      return -1;
                    }
                  }
                  else {
                    iVar12 = strcmp((pyVar1->data).scalar,"ocsp-update-interval");
                    if (iVar12 == 0) {
                      pyVar1 = (yoml_t_conflict *)ssl_options;
                      pyVar4 = node;
                      pyVar5 = ocsp_update_interval_node;
                      pyVar6 = ocsp_update_cmd;
                      pyVar7 = cipher_suite;
                      pyVar8 = max_version;
                      pyVar9 = min_version;
                      pyVar10 = dh_file;
                      pyVar11 = key_file;
                      if (node->type != YOML_TYPE_SCALAR) {
                        h2o_configurator_errprintf
                                  ((h2o_configurator_command_t *)ctx_local,node,
                                   "property of `ocsp-update-interval` must be a string");
                        return -1;
                      }
                    }
                    else {
                      iVar12 = strcmp((pyVar1->data).scalar,"ocsp-max-failures");
                      if (iVar12 == 0) {
                        pyVar1 = node;
                        pyVar4 = ocsp_max_failures_node;
                        pyVar5 = ocsp_update_interval_node;
                        pyVar6 = ocsp_update_cmd;
                        pyVar7 = cipher_suite;
                        pyVar8 = max_version;
                        pyVar9 = min_version;
                        pyVar10 = dh_file;
                        pyVar11 = key_file;
                        if (node->type != YOML_TYPE_SCALAR) {
                          h2o_configurator_errprintf
                                    ((h2o_configurator_command_t *)ctx_local,node,
                                     "property of `ocsp-max-failures` must be a string");
                          return -1;
                        }
                      }
                      else {
                        iVar12 = strcmp((pyVar1->data).scalar,"dh-file");
                        if (iVar12 == 0) {
                          pyVar1 = (yoml_t_conflict *)ssl_options;
                          pyVar4 = ocsp_max_failures_node;
                          pyVar5 = ocsp_update_interval_node;
                          pyVar6 = ocsp_update_cmd;
                          pyVar7 = cipher_suite;
                          pyVar8 = max_version;
                          pyVar9 = node;
                          pyVar10 = dh_file;
                          pyVar11 = key_file;
                          if (node->type != YOML_TYPE_SCALAR) {
                            h2o_configurator_errprintf
                                      ((h2o_configurator_command_t *)ctx_local,node,
                                       "property of `dh-file` must be a string");
                            return -1;
                          }
                        }
                        else {
                          iVar12 = strcmp((pyVar1->data).scalar,"cipher-preference");
                          if (iVar12 == 0) {
                            if ((node->type == YOML_TYPE_SCALAR) &&
                               (iVar12 = strcasecmp((node->data).scalar,"client"), iVar12 == 0)) {
                              ocsp_update_interval = ocsp_update_interval & 0xffffffffffbfffff;
                              pyVar1 = (yoml_t_conflict *)ssl_options;
                              pyVar4 = ocsp_max_failures_node;
                              pyVar5 = ocsp_update_interval_node;
                              pyVar6 = ocsp_update_cmd;
                              pyVar7 = cipher_suite;
                              pyVar8 = max_version;
                              pyVar9 = min_version;
                              pyVar10 = dh_file;
                              pyVar11 = key_file;
                            }
                            else {
                              if ((node->type != YOML_TYPE_SCALAR) ||
                                 (iVar12 = strcasecmp((node->data).scalar,"server"), iVar12 != 0)) {
                                h2o_configurator_errprintf
                                          ((h2o_configurator_command_t *)ctx_local,node,
                                           "property of `cipher-preference` must be either of: `client`, `server`"
                                          );
                                return -1;
                              }
                              ocsp_update_interval = ocsp_update_interval | 0x400000;
                              pyVar1 = (yoml_t_conflict *)ssl_options;
                              pyVar4 = ocsp_max_failures_node;
                              pyVar5 = ocsp_update_interval_node;
                              pyVar6 = ocsp_update_cmd;
                              pyVar7 = cipher_suite;
                              pyVar8 = max_version;
                              pyVar9 = min_version;
                              pyVar10 = dh_file;
                              pyVar11 = key_file;
                            }
                          }
                          else {
                            iVar12 = strcmp((pyVar1->data).scalar,"neverbleed");
                            if (iVar12 != 0) {
                              h2o_configurator_errprintf
                                        ((h2o_configurator_command_t *)ctx_local,pyVar1,
                                         "unknown property: %s",(pyVar1->data).scalar);
                              return -1;
                            }
                            if ((node->type == YOML_TYPE_SCALAR) &&
                               (iVar12 = strcasecmp((node->data).scalar,"ON"), iVar12 == 0)) {
                              bVar3 = true;
                              pyVar1 = (yoml_t_conflict *)ssl_options;
                              pyVar4 = ocsp_max_failures_node;
                              pyVar5 = ocsp_update_interval_node;
                              pyVar6 = ocsp_update_cmd;
                              pyVar7 = cipher_suite;
                              pyVar8 = max_version;
                              pyVar9 = min_version;
                              pyVar10 = dh_file;
                              pyVar11 = key_file;
                            }
                            else {
                              if ((node->type != YOML_TYPE_SCALAR) ||
                                 (iVar12 = strcasecmp((node->data).scalar,"OFF"), iVar12 != 0)) {
                                h2o_configurator_errprintf
                                          ((h2o_configurator_command_t *)ctx_local,node,
                                           "property of `neverbleed` must be either of: `ON`, `OFF")
                                ;
                                return -1;
                              }
                              bVar3 = false;
                              pyVar1 = (yoml_t_conflict *)ssl_options;
                              pyVar4 = ocsp_max_failures_node;
                              pyVar5 = ocsp_update_interval_node;
                              pyVar6 = ocsp_update_cmd;
                              pyVar7 = cipher_suite;
                              pyVar8 = max_version;
                              pyVar9 = min_version;
                              pyVar10 = dh_file;
                              pyVar11 = key_file;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    key_file = pyVar11;
    dh_file = pyVar10;
    min_version = pyVar9;
    max_version = pyVar8;
    cipher_suite = pyVar7;
    ocsp_update_cmd = pyVar6;
    ocsp_update_interval_node = pyVar5;
    ocsp_max_failures_node = pyVar4;
    ssl_options = (long)pyVar1;
  }
  if (key_file == (yoml_t *)0x0) {
    h2o_configurator_errprintf
              ((h2o_configurator_command_t *)ctx_local,(yoml_t_conflict *)listener_local,
               "could not find mandatory property `certificate-file`");
    return -1;
  }
  if (dh_file == (yoml_t *)0x0) {
    h2o_configurator_errprintf
              ((h2o_configurator_command_t *)ctx_local,(yoml_t_conflict *)listener_local,
               "could not find mandatory property `key-file`");
    return -1;
  }
  if (max_version == (yoml_t *)0x0) {
    ocsp_update_interval = ocsp_update_interval | 0x2000000;
  }
  else {
    iVar12 = strcasecmp((max_version->data).scalar,"sslv2");
    if ((iVar12 != 0) && (iVar12 = strcasecmp((max_version->data).scalar,"sslv3"), iVar12 != 0)) {
      iVar12 = strcasecmp((max_version->data).scalar,"tlsv1");
      if (iVar12 == 0) {
        ocsp_update_interval = ocsp_update_interval | 0x2000000;
      }
      else {
        iVar12 = strcasecmp((max_version->data).scalar,"tlsv1.1");
        if (iVar12 == 0) {
          ocsp_update_interval = ocsp_update_interval | 0x6000000;
        }
        else {
          iVar12 = strcasecmp((max_version->data).scalar,"tlsv1.2");
          if (iVar12 == 0) {
            ocsp_update_interval = ocsp_update_interval | 0x16000000;
          }
          else {
            iVar12 = strcasecmp((max_version->data).scalar,"tlsv1.3");
            if (iVar12 == 0) {
              ocsp_update_interval = ocsp_update_interval | 0x1e000000;
            }
            else {
              h2o_configurator_errprintf
                        ((h2o_configurator_command_t *)ctx_local,max_version,
                         "unknown protocol version: %s",(max_version->data).scalar);
            }
          }
        }
      }
    }
  }
  if (cipher_suite != (yoml_t *)0x0) {
    iVar12 = strcasecmp((cipher_suite->data).scalar,"tlsv1.3");
    bVar14 = -1 < iVar12;
  }
  if (((ocsp_max_failures_node == (yoml_t *)0x0) ||
      (iVar12 = h2o_configurator_scanf
                          ((h2o_configurator_command_t *)ctx_local,ocsp_max_failures_node,"%lu",
                           &use_neverbleed), iVar12 == 0)) &&
     ((ssl_options == 0 ||
      (iVar12 = h2o_configurator_scanf
                          ((h2o_configurator_command_t *)ctx_local,(yoml_t_conflict *)ssl_options,
                           "%u",&use_picotls), iVar12 == 0)))) {
    if (listen_node_local->filename != (char *)0x0) {
      for (ssl_config_1 = (listener_ssl_config_t *)0x0;
          ssl_config_1 != (listener_ssl_config_t *)(plStack_38->ssl).size;
          ssl_config_1 = (listener_ssl_config_t *)((long)&(ssl_config_1->hostnames).entries + 1)) {
        errbuf._248_8_ = (plStack_38->ssl).entries[(long)ssl_config_1];
        iVar12 = strcmp(((listener_ssl_config_t *)errbuf._248_8_)->certificate_file,
                        (key_file->data).scalar);
        if (iVar12 == 0) {
          listener_setup_ssl_add_host
                    ((listener_ssl_config_t *)errbuf._248_8_,
                     *(h2o_iovec_t *)(listen_node_local->filename + 8));
          return 0;
        }
      }
    }
    ocsp_update_interval = ocsp_update_interval | 0x20000;
    meth = (SSL_METHOD *)TLS_server_method();
    certificate_file = (yoml_t *)SSL_CTX_new(meth);
    SSL_CTX_set_options(certificate_file,ocsp_update_interval);
    setup_ecc_key((SSL_CTX *)certificate_file);
    iVar12 = SSL_CTX_use_certificate_chain_file((SSL_CTX *)certificate_file,(key_file->data).scalar)
    ;
    if (iVar12 == 1) {
      if ((bVar3) && (conf.run_mode == RUN_MODE_MASTER || conf.run_mode == RUN_MODE_DAEMON)) {
        bVar3 = false;
      }
      if (bVar3) {
        if (neverbleed == (neverbleed_t *)0x0) {
          neverbleed = (neverbleed_t *)h2o_mem_alloc(0xa0);
          iVar12 = neverbleed_init(neverbleed,(char *)&bio);
          if (iVar12 != 0) {
            fprintf(_stderr,"%s\n",&bio);
            abort();
          }
        }
        iVar12 = neverbleed_load_private_key_file
                           (neverbleed,(SSL_CTX *)certificate_file,(dh_file->data).scalar,
                            (char *)&bio);
        if (iVar12 != 1) {
          h2o_configurator_errprintf
                    ((h2o_configurator_command_t *)ctx_local,dh_file,
                     "failed to load private key file:%s:%s\n",(dh_file->data).scalar,&bio);
          goto LAB_002094a8;
        }
      }
      else {
        iVar12 = SSL_CTX_use_PrivateKey_file((SSL_CTX *)certificate_file,(dh_file->data).scalar,1);
        if (iVar12 != 1) {
          h2o_configurator_errprintf
                    ((h2o_configurator_command_t *)ctx_local,dh_file,
                     "failed to load private key file:%s\n",(dh_file->data).scalar);
          ERR_print_errors_cb(on_openssl_print_errors,_stderr);
          goto LAB_002094a8;
        }
      }
      if ((ocsp_update_cmd == (yoml_t *)0x0) ||
         (iVar12 = SSL_CTX_set_cipher_list
                             ((SSL_CTX *)certificate_file,(ocsp_update_cmd->data).scalar),
         iVar12 == 1)) {
        if (min_version == (yoml_t *)0x0) {
LAB_002090ee:
          h2o_ssl_register_npn_protocols((SSL_CTX *)certificate_file,h2o_npn_protocols);
          h2o_ssl_register_alpn_protocols((SSL_CTX *)certificate_file,h2o_alpn_protocols);
          if ((plStack_38->ssl).size == 1) {
            SSL_CTX_callback_ctrl((SSL_CTX *)(*(plStack_38->ssl).entries)->ctx,0x35,on_sni_callback)
            ;
            SSL_CTX_ctrl((SSL_CTX *)(*(plStack_38->ssl).entries)->ctx,0x36,0,plStack_38);
          }
          local_1f0 = (listener_ssl_config_t *)h2o_mem_alloc(0x78);
          memset(local_1f0,0,0x78);
          h2o_vector__reserve((h2o_mem_pool_t *)0x0,(h2o_vector_t *)&plStack_38->ssl,8,
                              (plStack_38->ssl).size + 1);
          sVar2 = (plStack_38->ssl).size;
          (plStack_38->ssl).size = sVar2 + 1;
          (plStack_38->ssl).entries[sVar2] = local_1f0;
          if (listen_node_local->filename != (char *)0x0) {
            listener_setup_ssl_add_host(local_1f0,*(h2o_iovec_t *)(listen_node_local->filename + 8))
            ;
          }
          local_1f0->ctx = (SSL_CTX *)certificate_file;
          local_200 = h2o_strdup((h2o_mem_pool_t *)0x0,(key_file->data).scalar,0xffffffffffffffff);
          local_1f0->certificate_file = local_200.base;
          SSL_CTX_callback_ctrl((SSL_CTX *)certificate_file,0x3f,on_staple_ocsp_ossl);
          SSL_CTX_ctrl((SSL_CTX *)certificate_file,0x40,0,local_1f0);
          pthread_mutex_init((pthread_mutex_t *)&(local_1f0->ocsp_stapling).response,
                             (pthread_mutexattr_t *)0x0);
          if (ocsp_update_interval_node == (yoml_t *)0x0) {
            local_228 = (h2o_buffer_t *)0x2bcb38;
          }
          else {
            _respbuf = h2o_strdup((h2o_mem_pool_t *)0x0,(ocsp_update_interval_node->data).scalar,
                                  0xffffffffffffffff);
            local_228 = respbuf;
          }
          (local_1f0->ocsp_stapling).cmd = (char *)local_228;
          if (_use_neverbleed != 0) {
            if (conf.run_mode == RUN_MODE_WORKER) {
              (local_1f0->ocsp_stapling).interval = _use_neverbleed;
              (local_1f0->ocsp_stapling).max_failures = use_picotls;
              h2o_multithread_create_thread
                        (&(local_1f0->ocsp_stapling).updater_tid,(pthread_attr_t *)0x0,
                         ocsp_updater_thread,local_1f0);
            }
            else if ((1 < conf.run_mode - RUN_MODE_MASTER) && (conf.run_mode == RUN_MODE_TEST)) {
              fprintf(_stderr,"[OCSP Stapling] testing for certificate file:%s\n",
                      (key_file->data).scalar);
              iVar12 = get_ocsp_response((key_file->data).scalar,(local_1f0->ocsp_stapling).cmd,
                                         (h2o_buffer_t **)&errstr);
              if (iVar12 == 0) {
                h2o_buffer_dispose((h2o_buffer_t **)&errstr);
                fprintf(_stderr,"[OCSP Stapling] stapling works for file:%s\n",
                        (key_file->data).scalar);
              }
              else if (iVar12 == 0x4b) {
                h2o_configurator_errprintf
                          ((h2o_configurator_command_t *)ctx_local,key_file,
                           "[OCSP Stapling] temporary failed for file:%s\n",(key_file->data).scalar)
                ;
              }
              else {
                h2o_configurator_errprintf
                          ((h2o_configurator_command_t *)ctx_local,key_file,
                           "[OCSP Stapling] does not work, will be disabled for file:%s\n",
                           (key_file->data).scalar);
              }
            }
          }
          if ((bVar14) &&
             (pcVar13 = listener_setup_ssl_picotls(plStack_38,local_1f0,(SSL_CTX *)certificate_file)
             , pcVar13 != (char *)0x0)) {
            h2o_configurator_errprintf
                      ((h2o_configurator_command_t *)ctx_local,(yoml_t_conflict *)listener_local,
                       "%s; TLS 1.3 will be disabled\n",pcVar13);
          }
          return 0;
        }
        dh = (DH *)BIO_new_file((min_version->data).scalar,"r");
        if ((BIO *)dh == (BIO *)0x0) {
          h2o_configurator_errprintf
                    ((h2o_configurator_command_t *)ctx_local,min_version,
                     "failed to load dhparam file:%s\n",(min_version->data).scalar);
          ERR_print_errors_cb(on_openssl_print_errors,_stderr);
        }
        else {
          ssl_config = (listener_ssl_config_t *)
                       PEM_read_bio_DHparams((BIO *)dh,(DH **)0x0,(undefined1 *)0x0,(void *)0x0);
          BIO_free((BIO *)dh);
          if (ssl_config != (listener_ssl_config_t *)0x0) {
            SSL_CTX_ctrl((SSL_CTX *)certificate_file,3,0,ssl_config);
            SSL_CTX_set_options(certificate_file,0);
            DH_free((DH *)ssl_config);
            goto LAB_002090ee;
          }
          h2o_configurator_errprintf
                    ((h2o_configurator_command_t *)ctx_local,min_version,
                     "failed to load dhparam file:%s\n",(min_version->data).scalar);
          ERR_print_errors_cb(on_openssl_print_errors,_stderr);
        }
      }
      else {
        h2o_configurator_errprintf
                  ((h2o_configurator_command_t *)ctx_local,ocsp_update_cmd,
                   "failed to setup SSL cipher suite\n");
        ERR_print_errors_cb(on_openssl_print_errors,_stderr);
      }
    }
    else {
      h2o_configurator_errprintf
                ((h2o_configurator_command_t *)ctx_local,key_file,
                 "failed to load certificate file:%s\n",(key_file->data).scalar);
      ERR_print_errors_cb(on_openssl_print_errors,_stderr);
    }
  }
LAB_002094a8:
  if (certificate_file != (yoml_t *)0x0) {
    SSL_CTX_free((SSL_CTX *)certificate_file);
  }
  return -1;
}

Assistant:

static int listener_setup_ssl(h2o_configurator_command_t *cmd, h2o_configurator_context_t *ctx, yoml_t *listen_node,
                              yoml_t *ssl_node, struct listener_config_t *listener, int listener_is_new)
{
    SSL_CTX *ssl_ctx = NULL;
    yoml_t *certificate_file = NULL, *key_file = NULL, *dh_file = NULL, *min_version = NULL, *max_version = NULL,
           *cipher_suite = NULL, *ocsp_update_cmd = NULL, *ocsp_update_interval_node = NULL, *ocsp_max_failures_node = NULL;
    long ssl_options = SSL_OP_ALL;
    uint64_t ocsp_update_interval = 4 * 60 * 60; /* defaults to 4 hours */
    unsigned ocsp_max_failures = 3;              /* defaults to 3; permit 3 failures before temporary disabling OCSP stapling */
    int use_neverbleed = 1, use_picotls = 1;     /* enabled by default */

    if (!listener_is_new) {
        if (listener->ssl.size != 0 && ssl_node == NULL) {
            h2o_configurator_errprintf(cmd, listen_node, "cannot accept HTTP; already defined to accept HTTPS");
            return -1;
        }
        if (listener->ssl.size == 0 && ssl_node != NULL) {
            h2o_configurator_errprintf(cmd, ssl_node, "cannot accept HTTPS; already defined to accept HTTP");
            return -1;
        }
    }

    if (ssl_node == NULL)
        return 0;
    if (ssl_node->type != YOML_TYPE_MAPPING) {
        h2o_configurator_errprintf(cmd, ssl_node, "`ssl` is not a mapping");
        return -1;
    }

    { /* parse */
        size_t i;
        for (i = 0; i != ssl_node->data.sequence.size; ++i) {
            yoml_t *key = ssl_node->data.mapping.elements[i].key, *value = ssl_node->data.mapping.elements[i].value;
            /* obtain the target command */
            if (key->type != YOML_TYPE_SCALAR) {
                h2o_configurator_errprintf(NULL, key, "command must be a string");
                return -1;
            }
#define FETCH_PROPERTY(n, p)                                                                                                       \
    if (strcmp(key->data.scalar, n) == 0) {                                                                                        \
        if (value->type != YOML_TYPE_SCALAR) {                                                                                     \
            h2o_configurator_errprintf(cmd, value, "property of `" n "` must be a string");                                        \
            return -1;                                                                                                             \
        }                                                                                                                          \
        p = value;                                                                                                                 \
        continue;                                                                                                                  \
    }
            FETCH_PROPERTY("certificate-file", certificate_file);
            FETCH_PROPERTY("key-file", key_file);
            FETCH_PROPERTY("min-version", min_version);
            FETCH_PROPERTY("minimum-version", min_version);
            FETCH_PROPERTY("max-version", max_version);
            FETCH_PROPERTY("maximum-version", max_version);
            FETCH_PROPERTY("cipher-suite", cipher_suite);
            FETCH_PROPERTY("ocsp-update-cmd", ocsp_update_cmd);
            FETCH_PROPERTY("ocsp-update-interval", ocsp_update_interval_node);
            FETCH_PROPERTY("ocsp-max-failures", ocsp_max_failures_node);
            FETCH_PROPERTY("dh-file", dh_file);
            if (strcmp(key->data.scalar, "cipher-preference") == 0) {
                if (value->type == YOML_TYPE_SCALAR && strcasecmp(value->data.scalar, "client") == 0) {
                    ssl_options &= ~SSL_OP_CIPHER_SERVER_PREFERENCE;
                } else if (value->type == YOML_TYPE_SCALAR && strcasecmp(value->data.scalar, "server") == 0) {
                    ssl_options |= SSL_OP_CIPHER_SERVER_PREFERENCE;
                } else {
                    h2o_configurator_errprintf(cmd, value, "property of `cipher-preference` must be either of: `client`, `server`");
                    return -1;
                }
                continue;
            }
            if (strcmp(key->data.scalar, "neverbleed") == 0) {
                if (value->type == YOML_TYPE_SCALAR && strcasecmp(value->data.scalar, "ON") == 0) {
                    /* no need to enable neverbleed for daemon / master */
                    use_neverbleed = 1;
                } else if (value->type == YOML_TYPE_SCALAR && strcasecmp(value->data.scalar, "OFF") == 0) {
                    use_neverbleed = 0;
                } else {
                    h2o_configurator_errprintf(cmd, value, "property of `neverbleed` must be either of: `ON`, `OFF");
                    return -1;
                }
                continue;
            }
            h2o_configurator_errprintf(cmd, key, "unknown property: %s", key->data.scalar);
            return -1;
#undef FETCH_PROPERTY
        }
        if (certificate_file == NULL) {
            h2o_configurator_errprintf(cmd, ssl_node, "could not find mandatory property `certificate-file`");
            return -1;
        }
        if (key_file == NULL) {
            h2o_configurator_errprintf(cmd, ssl_node, "could not find mandatory property `key-file`");
            return -1;
        }
        if (min_version != NULL) {
#define MAP(tok, op)                                                                                                               \
    if (strcasecmp(min_version->data.scalar, tok) == 0) {                                                                          \
        ssl_options |= (op);                                                                                                       \
        goto VersionFound;                                                                                                         \
    }
            MAP("sslv2", 0);
            MAP("sslv3", SSL_OP_NO_SSLv2);
            MAP("tlsv1", SSL_OP_NO_SSLv2 | SSL_OP_NO_SSLv3);
            MAP("tlsv1.1", SSL_OP_NO_SSLv2 | SSL_OP_NO_SSLv3 | SSL_OP_NO_TLSv1);
#ifdef SSL_OP_NO_TLSv1_1
            MAP("tlsv1.2", SSL_OP_NO_SSLv2 | SSL_OP_NO_SSLv3 | SSL_OP_NO_TLSv1 | SSL_OP_NO_TLSv1_1);
#endif
#ifdef SSL_OP_NO_TLSv1_2
            MAP("tlsv1.3", SSL_OP_NO_SSLv2 | SSL_OP_NO_SSLv3 | SSL_OP_NO_TLSv1 | SSL_OP_NO_TLSv1_1 | SSL_OP_NO_TLSv1_2);
#endif
#undef MAP
            h2o_configurator_errprintf(cmd, min_version, "unknown protocol version: %s", min_version->data.scalar);
        VersionFound:;
        } else {
            /* default is >= TLSv1 */
            ssl_options |= SSL_OP_NO_SSLv2 | SSL_OP_NO_SSLv3;
        }
        if (max_version != NULL) {
            if (strcasecmp(max_version->data.scalar, "tlsv1.3") < 0)
                use_picotls = 0;
        }
        if (ocsp_update_interval_node != NULL) {
            if (h2o_configurator_scanf(cmd, ocsp_update_interval_node, "%" PRIu64, &ocsp_update_interval) != 0)
                goto Error;
        }
        if (ocsp_max_failures_node != NULL) {
            if (h2o_configurator_scanf(cmd, ocsp_max_failures_node, "%u", &ocsp_max_failures) != 0)
                goto Error;
        }
    }

    /* add the host to the existing SSL config, if the certificate file is already registered */
    if (ctx->hostconf != NULL) {
        size_t i;
        for (i = 0; i != listener->ssl.size; ++i) {
            struct listener_ssl_config_t *ssl_config = listener->ssl.entries[i];
            if (strcmp(ssl_config->certificate_file, certificate_file->data.scalar) == 0) {
                listener_setup_ssl_add_host(ssl_config, ctx->hostconf->authority.hostport);
                return 0;
            }
        }
    }

/* disable tls compression to avoid "CRIME" attacks (see http://en.wikipedia.org/wiki/CRIME) */
#ifdef SSL_OP_NO_COMPRESSION
    ssl_options |= SSL_OP_NO_COMPRESSION;
#endif

    /* setup */
    ssl_ctx = SSL_CTX_new(SSLv23_server_method());
    SSL_CTX_set_options(ssl_ctx, ssl_options);

    setup_ecc_key(ssl_ctx);
    if (SSL_CTX_use_certificate_chain_file(ssl_ctx, certificate_file->data.scalar) != 1) {
        h2o_configurator_errprintf(cmd, certificate_file, "failed to load certificate file:%s\n", certificate_file->data.scalar);
        ERR_print_errors_cb(on_openssl_print_errors, stderr);
        goto Error;
    }
    if (use_neverbleed) {
        /* disable neverbleed in case the process is not going to serve requests */
        switch (conf.run_mode) {
        case RUN_MODE_DAEMON:
        case RUN_MODE_MASTER:
            use_neverbleed = 0;
            break;
        default:
            break;
        }
    }
    if (use_neverbleed) {
        char errbuf[NEVERBLEED_ERRBUF_SIZE];
        if (neverbleed == NULL) {
            neverbleed = h2o_mem_alloc(sizeof(*neverbleed));
            if (neverbleed_init(neverbleed, errbuf) != 0) {
                fprintf(stderr, "%s\n", errbuf);
                abort();
            }
        }
        if (neverbleed_load_private_key_file(neverbleed, ssl_ctx, key_file->data.scalar, errbuf) != 1) {
            h2o_configurator_errprintf(cmd, key_file, "failed to load private key file:%s:%s\n", key_file->data.scalar, errbuf);
            goto Error;
        }
    } else {
        if (SSL_CTX_use_PrivateKey_file(ssl_ctx, key_file->data.scalar, SSL_FILETYPE_PEM) != 1) {
            h2o_configurator_errprintf(cmd, key_file, "failed to load private key file:%s\n", key_file->data.scalar);
            ERR_print_errors_cb(on_openssl_print_errors, stderr);
            goto Error;
        }
    }
    if (cipher_suite != NULL && SSL_CTX_set_cipher_list(ssl_ctx, cipher_suite->data.scalar) != 1) {
        h2o_configurator_errprintf(cmd, cipher_suite, "failed to setup SSL cipher suite\n");
        ERR_print_errors_cb(on_openssl_print_errors, stderr);
        goto Error;
    }
    if (dh_file != NULL) {
        BIO *bio = BIO_new_file(dh_file->data.scalar, "r");
        if (bio == NULL) {
            h2o_configurator_errprintf(cmd, dh_file, "failed to load dhparam file:%s\n", dh_file->data.scalar);
            ERR_print_errors_cb(on_openssl_print_errors, stderr);
            goto Error;
        }
        DH *dh = PEM_read_bio_DHparams(bio, NULL, NULL, NULL);
        BIO_free(bio);
        if (dh == NULL) {
            h2o_configurator_errprintf(cmd, dh_file, "failed to load dhparam file:%s\n", dh_file->data.scalar);
            ERR_print_errors_cb(on_openssl_print_errors, stderr);
            goto Error;
        }
        SSL_CTX_set_tmp_dh(ssl_ctx, dh);
        SSL_CTX_set_options(ssl_ctx, SSL_OP_SINGLE_DH_USE);
        DH_free(dh);
    }

/* setup protocol negotiation methods */
#if H2O_USE_NPN
    h2o_ssl_register_npn_protocols(ssl_ctx, h2o_npn_protocols);
#endif
#if H2O_USE_ALPN
    h2o_ssl_register_alpn_protocols(ssl_ctx, h2o_alpn_protocols);
#endif

    /* set SNI callback to the first SSL context, when and only when it should be used */
    if (listener->ssl.size == 1) {
        SSL_CTX_set_tlsext_servername_callback(listener->ssl.entries[0]->ctx, on_sni_callback);
        SSL_CTX_set_tlsext_servername_arg(listener->ssl.entries[0]->ctx, listener);
    }

    /* create a new entry in the SSL context list */
    struct listener_ssl_config_t *ssl_config = h2o_mem_alloc(sizeof(*ssl_config));
    memset(ssl_config, 0, sizeof(*ssl_config));
    h2o_vector_reserve(NULL, &listener->ssl, listener->ssl.size + 1);
    listener->ssl.entries[listener->ssl.size++] = ssl_config;
    if (ctx->hostconf != NULL) {
        listener_setup_ssl_add_host(ssl_config, ctx->hostconf->authority.hostport);
    }
    ssl_config->ctx = ssl_ctx;
    ssl_config->certificate_file = h2o_strdup(NULL, certificate_file->data.scalar, SIZE_MAX).base;

#if !H2O_USE_OCSP
    if (ocsp_update_interval != 0)
        fprintf(stderr, "[OCSP Stapling] disabled (not support by the SSL library)\n");
#else
#ifndef OPENSSL_NO_OCSP
    SSL_CTX_set_tlsext_status_cb(ssl_ctx, on_staple_ocsp_ossl);
    SSL_CTX_set_tlsext_status_arg(ssl_ctx, ssl_config);
#endif
    pthread_mutex_init(&ssl_config->ocsp_stapling.response.mutex, NULL);
    ssl_config->ocsp_stapling.cmd =
        ocsp_update_cmd != NULL ? h2o_strdup(NULL, ocsp_update_cmd->data.scalar, SIZE_MAX).base : "share/h2o/fetch-ocsp-response";
    if (ocsp_update_interval != 0) {
        switch (conf.run_mode) {
        case RUN_MODE_WORKER:
            ssl_config->ocsp_stapling.interval =
                ocsp_update_interval; /* is also used as a flag for indicating if the updater thread was spawned */
            ssl_config->ocsp_stapling.max_failures = ocsp_max_failures;
            h2o_multithread_create_thread(&ssl_config->ocsp_stapling.updater_tid, NULL, ocsp_updater_thread, ssl_config);
            break;
        case RUN_MODE_MASTER:
        case RUN_MODE_DAEMON:
            /* nothing to do */
            break;
        case RUN_MODE_TEST: {
            h2o_buffer_t *respbuf;
            fprintf(stderr, "[OCSP Stapling] testing for certificate file:%s\n", certificate_file->data.scalar);
            switch (get_ocsp_response(certificate_file->data.scalar, ssl_config->ocsp_stapling.cmd, &respbuf)) {
            case 0:
                h2o_buffer_dispose(&respbuf);
                fprintf(stderr, "[OCSP Stapling] stapling works for file:%s\n", certificate_file->data.scalar);
                break;
            case EX_TEMPFAIL:
                h2o_configurator_errprintf(cmd, certificate_file, "[OCSP Stapling] temporary failed for file:%s\n",
                                           certificate_file->data.scalar);
                break;
            default:
                h2o_configurator_errprintf(cmd, certificate_file, "[OCSP Stapling] does not work, will be disabled for file:%s\n",
                                           certificate_file->data.scalar);
                break;
            }
        } break;
        }
    }
#endif

#if H2O_USE_PICOTLS
    if (use_picotls) {
        const char *errstr = listener_setup_ssl_picotls(listener, ssl_config, ssl_ctx);
        if (errstr != NULL)
            h2o_configurator_errprintf(cmd, ssl_node, "%s; TLS 1.3 will be disabled\n", errstr);
    }
#endif

    return 0;

Error:
    if (ssl_ctx != NULL)
        SSL_CTX_free(ssl_ctx);
    return -1;
}